

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2point_compression.cc
# Opt level: O0

bool S2DecodePointsCompressed(Decoder *decoder,int level,Span<Vector3<double>_> points)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  reference pVVar4;
  size_t sVar5;
  Iterator IVar6;
  uint local_fc;
  uint local_f8;
  uint32 index;
  int i_1;
  uint num_off_center;
  VType local_e8;
  VType local_e0;
  int local_d8;
  int local_d4;
  int face;
  pair<int,_int> vertex_pi_qi;
  int i;
  Iterator faces_iterator;
  NthDerivativeCoder qi_coder;
  NthDerivativeCoder pi_coder;
  undefined1 local_48 [8];
  Faces faces;
  int level_local;
  Decoder *decoder_local;
  Span<Vector3<double>_> points_local;
  
  points_local.ptr_ = (pointer)points.len_;
  decoder_local = (Decoder *)points.ptr_;
  faces.faces_.
  super__Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = level;
  anon_unknown.dwarf_39b09c::Faces::Faces((Faces *)local_48);
  sVar2 = absl::Span<Vector3<double>_>::size((Span<Vector3<double>_> *)&decoder_local);
  bVar1 = anon_unknown.dwarf_39b09c::Faces::Decode((Faces *)local_48,(int)sVar2,decoder);
  if (bVar1) {
    NthDerivativeCoder::NthDerivativeCoder((NthDerivativeCoder *)(qi_coder.memory_ + 8),2);
    NthDerivativeCoder::NthDerivativeCoder((NthDerivativeCoder *)&faces_iterator.face_index_,2);
    IVar6 = anon_unknown.dwarf_39b09c::Faces::GetIterator((Faces *)local_48);
    vertex_pi_qi.first = 0;
    while( true ) {
      faces_iterator.faces_ = IVar6._8_8_;
      stack0xffffffffffffff38 = IVar6.faces_;
      uVar3 = (ulong)vertex_pi_qi.first;
      sVar2 = absl::Span<Vector3<double>_>::size((Span<Vector3<double>_> *)&decoder_local);
      if (sVar2 <= uVar3) break;
      std::pair<int,_int>::pair<int,_int,_true>((pair<int,_int> *)&stack0xffffffffffffff2c);
      if (vertex_pi_qi.first == 0) {
        bVar1 = anon_unknown.dwarf_39b09c::DecodeFirstPointFixedLength
                          (decoder,faces.faces_.
                                   super__Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                           (NthDerivativeCoder *)(qi_coder.memory_ + 8),
                           (NthDerivativeCoder *)&faces_iterator.face_index_,
                           (pair<int,_int> *)&stack0xffffffffffffff2c);
        if (!bVar1) {
          points_local.len_._7_1_ = 0;
          goto LAB_004b2d10;
        }
      }
      else {
        bVar1 = anon_unknown.dwarf_39b09c::DecodePointCompressed
                          (decoder,faces.faces_.
                                   super__Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                           (NthDerivativeCoder *)(qi_coder.memory_ + 8),
                           (NthDerivativeCoder *)&faces_iterator.face_index_,
                           (pair<int,_int> *)&stack0xffffffffffffff2c);
        if (!bVar1) {
          points_local.len_._7_1_ = 0;
          goto LAB_004b2d10;
        }
      }
      local_d8 = anon_unknown.dwarf_39b09c::Faces::Iterator::Next((Iterator *)&vertex_pi_qi.second);
      anon_unknown.dwarf_39b09c::FacePiQitoXYZ
                ((S2Point *)&i_1,local_d8,local_d4,face,
                 faces.faces_.
                 super__Vector_base<(anonymous_namespace)::FaceRun,_std::allocator<(anonymous_namespace)::FaceRun>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      pVVar4 = absl::Span<Vector3<double>_>::operator[]
                         ((Span<Vector3<double>_> *)&decoder_local,(long)vertex_pi_qi.first);
      IVar6._8_8_ = faces_iterator.faces_;
      IVar6.faces_ = stack0xffffffffffffff38;
      pVVar4->c_[0] = _i_1;
      pVVar4->c_[1] = local_e8;
      pVVar4->c_[2] = local_e0;
      vertex_pi_qi.first = vertex_pi_qi.first + 1;
    }
    bVar1 = Decoder::get_varint32(decoder,&index);
    if ((bVar1) &&
       (uVar3 = (ulong)index,
       sVar2 = absl::Span<Vector3<double>_>::size((Span<Vector3<double>_> *)&decoder_local),
       uVar3 <= sVar2)) {
      for (local_f8 = 0; local_f8 < index; local_f8 = local_f8 + 1) {
        bVar1 = Decoder::get_varint32(decoder,&local_fc);
        if ((!bVar1) ||
           (uVar3 = (ulong)local_fc,
           sVar2 = absl::Span<Vector3<double>_>::size((Span<Vector3<double>_> *)&decoder_local),
           sVar2 <= uVar3)) {
          points_local.len_._7_1_ = 0;
          goto LAB_004b2d10;
        }
        sVar5 = Decoder::avail(decoder);
        if (sVar5 < 0x18) {
          points_local.len_._7_1_ = 0;
          goto LAB_004b2d10;
        }
        pVVar4 = absl::Span<Vector3<double>_>::operator[]
                           ((Span<Vector3<double>_> *)&decoder_local,(ulong)local_fc);
        Decoder::getn(decoder,pVVar4,0x18);
      }
      points_local.len_._7_1_ = 1;
    }
    else {
      points_local.len_._7_1_ = 0;
    }
  }
  else {
    points_local.len_._7_1_ = 0;
  }
LAB_004b2d10:
  anon_unknown.dwarf_39b09c::Faces::~Faces((Faces *)local_48);
  return (bool)(points_local.len_._7_1_ & 1);
}

Assistant:

bool S2DecodePointsCompressed(Decoder* decoder, int level,
                              Span<S2Point> points) {
  Faces faces;
  if (!faces.Decode(points.size(), decoder)) {
    return false;
  }

  NthDerivativeCoder pi_coder(kDerivativeEncodingOrder);
  NthDerivativeCoder qi_coder(kDerivativeEncodingOrder);
  Faces::Iterator faces_iterator = faces.GetIterator();
  for (int i = 0; i < points.size(); ++i) {
    pair<int, int> vertex_pi_qi;
    if (i == 0) {
      if (!DecodeFirstPointFixedLength(decoder, level, &pi_coder, &qi_coder,
                                       &vertex_pi_qi)) {
        return false;
      }
    } else {
      if (!DecodePointCompressed(decoder, level, &pi_coder, &qi_coder,
                                 &vertex_pi_qi)) {
        return false;
      }
    }

    int face = faces_iterator.Next();
    points[i] =
        FacePiQitoXYZ(face, vertex_pi_qi.first, vertex_pi_qi.second, level);
  }

  unsigned int num_off_center;
  if (!decoder->get_varint32(&num_off_center) ||
      num_off_center > points.size()) {
    return false;
  }
  for (int i = 0; i < num_off_center; ++i) {
    uint32 index;
    if (!decoder->get_varint32(&index) || index >= points.size()) {
      return false;
    }
    if (decoder->avail() < sizeof(points[index])) return false;
    decoder->getn(&points[index], sizeof(points[index]));
  }
  return true;
}